

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::stats_alert::stats_alert
          (stats_alert *this,stack_allocator *alloc,torrent_handle *h,int in,stat *s)

{
  stat *s_local;
  int in_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  stats_alert *this_local;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__stats_alert_009913b8;
  anon_unknown_62::stat_to_array(&this->transferred,s);
  this->interval = in;
  return;
}

Assistant:

stats_alert::stats_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, int in, stat const& s)
		: torrent_alert(alloc, h)
		, transferred(stat_to_array(s))
		, interval(in)
	{}